

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O2

void __thiscall cs::domain_manager::mark_set_as_struct(domain_manager *this,bool inherited)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"__PRAGMA_CS_STRUCT_DEFINITION__",&local_31);
  add_record(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (inherited) {
    std::__cxx11::string::string((string *)&local_30,"parent",&local_31);
    add_record(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void mark_set_as_struct(bool inherited = false)
		{
			add_record("__PRAGMA_CS_STRUCT_DEFINITION__");
			if (inherited)
				add_record("parent");
		}